

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBString *b,uchar splitChar)

{
  uchar uVar1;
  int len;
  int i;
  int iVar2;
  CBString local_48;
  
  iVar2 = 0;
  do {
    len = 0;
    for (i = iVar2; i < (b->super_tagbstring).slen; i = i + 1) {
      uVar1 = CBString::character(b,i);
      if (uVar1 == splitChar) break;
      len = len + 1;
    }
    if (iVar2 <= i) {
      CBString::CBString(&local_48,(b->super_tagbstring).data + iVar2,len);
      std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::
      emplace_back<Bstrlib::CBString>
                ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_48);
      CBString::~CBString(&local_48);
    }
    iVar2 = i + 1;
    if ((b->super_tagbstring).slen <= i) {
      return;
    }
  } while( true );
}

Assistant:

void CBStringList::split (const CBString& b, unsigned char splitChar) {
int p, i;

	p = 0;
	do {
		for (i = p; i < b.length (); i++) {
			if (b.character (i) == splitChar) break;
		}
		if (i >= p) this->push_back (CBString (&(b.data[p]), i - p));
		p = i + 1;
	} while (p <= b.length ());
}